

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_bit.cpp
# Opt level: O2

ssize_t cornelich::util::stop_bit::read(int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  ulong uVar2;
  logic_error *this;
  ulong uVar3;
  int iVar4;
  undefined4 in_register_0000003c;
  char *pcVar5;
  
  iVar4 = *__buf;
  *(int *)__buf = iVar4 + 1;
  cVar1 = *(char *)(CONCAT44(in_register_0000003c,__fd) + (long)iVar4);
  uVar2 = (ulong)cVar1;
  if ((long)uVar2 < 0) {
    uVar2 = (ulong)((int)cVar1 & 0x7f);
    pcVar5 = (char *)(CONCAT44(in_register_0000003c,__fd) + (long)(iVar4 + 1));
    iVar4 = iVar4 + 2;
    uVar3 = 7;
    while( true ) {
      *(int *)__buf = iVar4;
      cVar1 = *pcVar5;
      if (-1 < (long)cVar1) break;
      uVar2 = uVar2 | (ulong)((int)cVar1 & 0x7f) << ((byte)uVar3 & 0x3f);
      uVar3 = uVar3 + 7;
      pcVar5 = pcVar5 + 1;
      iVar4 = iVar4 + 1;
    }
    if (cVar1 == '\0') {
      if (0x3f < uVar3) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this,"Cannot read more than 10 stop bits of negative value");
        goto LAB_001281b7;
      }
      uVar2 = ~uVar2;
    }
    else {
      if (0x38 < uVar3) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this,"Cannot read more than 9 stop bits of positive value");
LAB_001281b7:
        __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      uVar2 = uVar2 | (long)cVar1 << ((byte)uVar3 & 0x3f);
    }
  }
  return uVar2;
}

Assistant:

std::int64_t read(const std::uint8_t * buffer, std::int32_t & offset)
{
    std::int64_t l;
    if ((l = (std::int8_t)buffer[offset++]) >= 0)
        return l;
    l &= 0x7FL;
    std::int64_t b;
    int count = 7;
    while ((b = (std::int8_t)buffer[offset++]) < 0)
    {
        l |= (b & 0x7FL) << count;
        count += 7;
    }
    if (b != 0)
    {
        if (count > 56)
            throw std::logic_error("Cannot read more than 9 stop bits of positive value");
        return l | (b << count);
    }
    else
    {
        if (count > 63)
            throw std::logic_error("Cannot read more than 10 stop bits of negative value");
        return ~l;
    }
}